

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeof.h
# Opt level: O0

void __thiscall
dap::BasicTypeInfo<dap::CompletionItem>::destruct
          (BasicTypeInfo<dap::CompletionItem> *this,void *ptr)

{
  void *ptr_local;
  BasicTypeInfo<dap::CompletionItem> *this_local;
  
  CompletionItem::~CompletionItem((CompletionItem *)ptr);
  return;
}

Assistant:

inline void destruct(void* ptr) const override {
    reinterpret_cast<T*>(ptr)->~T();
  }